

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O1

void __thiscall common::anon_unknown_0::CleanupHandler::~CleanupHandler(CleanupHandler *this)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ~CleanupHandler(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    operator_delete(this,0x28);
    return;
  }
  __stack_chk_fail();
}

Assistant:

~CleanupHandler() override { if (!m_cleanup) return; m_cleanup(); m_cleanup = nullptr; }